

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStructuralCurveMemberVarying *in;
  
  in = (IfcStructuralCurveMemberVarying *)operator_new(0x178);
  *(undefined ***)&(in->super_IfcStructuralCurveMember).field_0x160 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x168 = 0;
  *(char **)&in->field_0x170 = "IfcStructuralCurveMemberVarying";
  Assimp::IFC::Schema_2x3::IfcStructuralCurveMember::IfcStructuralCurveMember
            ((IfcStructuralCurveMember *)in,&PTR_construction_vtable_24__008c42d0);
  *(undefined ***)
   &(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = &PTR__IfcStructuralCurveMemberVarying_008c4178;
  *(undefined ***)&(in->super_IfcStructuralCurveMember).field_0x160 =
       &PTR__IfcStructuralCurveMemberVarying_008c42b8;
  *(undefined ***)
   &(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = &PTR__IfcStructuralCurveMemberVarying_008c41a0;
  (in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcStructuralCurveMemberVarying_008c41c8;
  *(undefined ***)
   &(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = &PTR__IfcStructuralCurveMemberVarying_008c41f0;
  *(undefined ***)
   &(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = &PTR__IfcStructuralCurveMemberVarying_008c4218;
  *(undefined ***)
   &(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = &PTR__IfcStructuralCurveMemberVarying_008c4240;
  *(undefined ***)
   &(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = &PTR__IfcStructuralCurveMemberVarying_008c4268;
  *(undefined ***)&(in->super_IfcStructuralCurveMember).field_0x150 =
       &PTR__IfcStructuralCurveMemberVarying_008c4290;
  GenericFill<Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying>(db,params,in);
  return (Object *)
         (&(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
           super_IfcProduct.super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcStructuralCurveMember).super_IfcStructuralMember.
                             super_IfcStructuralItem.super_IfcProduct.super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }